

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgloadr.c
# Opt level: O2

FT_Error FT_GlyphLoader_CreateExtra(FT_GlyphLoader loader)

{
  FT_Vector *pFVar1;
  int local_1c [2];
  FT_Error error;
  
  pFVar1 = (FT_Vector *)
           ft_mem_realloc(loader->memory,0x10,0,(ulong)(loader->max_points * 2),(void *)0x0,local_1c
                         );
  (loader->base).extra_points = pFVar1;
  if (local_1c[0] == 0) {
    loader->use_extra = '\x01';
    (loader->base).extra_points2 = pFVar1 + loader->max_points;
    FT_GlyphLoader_Adjust_Points(loader);
  }
  return local_1c[0];
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_GlyphLoader_CreateExtra( FT_GlyphLoader  loader )
  {
    FT_Error   error;
    FT_Memory  memory = loader->memory;


    if ( !FT_NEW_ARRAY( loader->base.extra_points, 2 * loader->max_points ) )
    {
      loader->use_extra          = 1;
      loader->base.extra_points2 = loader->base.extra_points +
                                   loader->max_points;

      FT_GlyphLoader_Adjust_Points( loader );
    }
    return error;
  }